

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

CAddress * GetBindAddress(CAddress *__return_storage_ptr__,Sock *sock)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  socklen_t sockaddr_bind_len;
  sockaddr_storage sockaddr_bind;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CAddress::CAddress(__return_storage_ptr__);
  iVar3 = (*sock->_vptr_Sock[0xb])(sock,&sockaddr_bind);
  if (iVar3 == 0) {
    CService::SetSockAddr(&__return_storage_ptr__->super_CService,(sockaddr *)&sockaddr_bind);
  }
  else {
    bVar2 = LogAcceptCategory(NET,Warning);
    if (bVar2) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "GetBindAddress";
      logging_function._M_len = 0xe;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x17f,NET,Warning,(ConstevalFormatString<0U>)0xc99a47)
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CAddress GetBindAddress(const Sock& sock)
{
    CAddress addr_bind;
    struct sockaddr_storage sockaddr_bind;
    socklen_t sockaddr_bind_len = sizeof(sockaddr_bind);
    if (!sock.GetSockName((struct sockaddr*)&sockaddr_bind, &sockaddr_bind_len)) {
        addr_bind.SetSockAddr((const struct sockaddr*)&sockaddr_bind);
    } else {
        LogPrintLevel(BCLog::NET, BCLog::Level::Warning, "getsockname failed\n");
    }
    return addr_bind;
}